

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O3

void __thiscall minihttp::SocketSet::deleteAll(SocketSet *this)

{
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (this->_store)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_store)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    if (*(long **)(p_Var1 + 1) != (long *)0x0) {
      (**(code **)(**(long **)(p_Var1 + 1) + 8))();
    }
  }
  std::
  _Rb_tree<minihttp::TcpSocket_*,_std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>,_std::_Select1st<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>,_std::less<minihttp::TcpSocket_*>,_std::allocator<std::pair<minihttp::TcpSocket_*const,_minihttp::SocketSet::SocketSetData>_>_>
  ::clear(&(this->_store)._M_t);
  return;
}

Assistant:

void SocketSet::deleteAll(void)
{
    for(Store::iterator it = _store.begin(); it != _store.end(); ++it)
        delete it->first;
    _store.clear();
}